

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
::write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
           *this,unsigned_long_long value)

{
  char *__last;
  bool bVar1;
  uint uVar2;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar3;
  long lVar4;
  byte bVar5;
  unsigned_long_long uVar6;
  char *pcVar7;
  char acStack_28 [32];
  
  lVar4 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar2 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  __last = acStack_28 +
           ((uVar2 - (value < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)[uVar2]))
           + 1);
  uVar6 = value;
  pcVar7 = __last;
  if (99 < value) {
    do {
      uVar6 = value / 100;
      *(undefined2 *)(pcVar7 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)value + (int)uVar6 * -100) * 2)
      ;
      pcVar7 = pcVar7 + -2;
      bVar1 = 9999 < value;
      value = uVar6;
    } while (bVar1);
  }
  bVar3.container = (this->out_).container;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar4 = -1;
  }
  else {
    pcVar7[-1] = internal::basic_data<void>::DIGITS[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[uVar6 * 2 & 0x1fffffffe];
    lVar4 = -2;
  }
  pcVar7[lVar4] = bVar5;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (acStack_28,__last,bVar3);
  (this->out_).container = bVar3.container;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }